

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

void __thiscall CmdLineArgsParser::ParseNumberRange(CmdLineArgsParser *this,NumberRange *pRange)

{
  RealCount *pRVar1;
  WCHAR WVar2;
  uint uVar3;
  int iVar4;
  Type pSVar5;
  LPWSTR pWVar6;
  undefined8 *puVar7;
  char16_t *pcVar8;
  
  do {
    uVar3 = ParseInteger(this);
    WVar2 = *this->pszCurrentArg;
    if ((ushort)WVar2 < 0x2d) {
      if (WVar2 != L',') {
        if ((WVar2 == L'\0') || (WVar2 == L' ')) {
          pSVar5 = (Type)Memory::NoCheckHeapAllocator::Alloc
                                   ((pRange->super_RangeBase<int>).range.allocator,0x10);
          pSVar5[1].next = (Type)((ulong)uVar3 * 0x100000001);
          pSVar5->next = (pRange->super_RangeBase<int>).range.
                         super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>
                         .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
          (pRange->super_RangeBase<int>).range.
          super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
          super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = pSVar5;
          pRVar1 = &(pRange->super_RangeBase<int>).range.
                    super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
                    super_RealCount;
          pRVar1->count = pRVar1->count + 1;
          return;
        }
        goto LAB_00351486;
      }
      pSVar5 = (Type)Memory::NoCheckHeapAllocator::Alloc
                               ((pRange->super_RangeBase<int>).range.allocator,0x10);
      pSVar5[1].next = (Type)((ulong)uVar3 * 0x100000001);
      pSVar5->next = (pRange->super_RangeBase<int>).range.
                     super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
                     super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
      (pRange->super_RangeBase<int>).range.
      super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
      super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = pSVar5;
      pRVar1 = &(pRange->super_RangeBase<int>).range.
                super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      pWVar6 = this->pszCurrentArg;
    }
    else {
      if (WVar2 != L'-') goto LAB_00351486;
      this->pszCurrentArg = this->pszCurrentArg + 1;
      iVar4 = ParseInteger(this);
      if (iVar4 < (int)uVar3) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar8 = L"Range start must be less than range end";
        goto LAB_003514aa;
      }
      pSVar5 = (Type)Memory::NoCheckHeapAllocator::Alloc
                               ((pRange->super_RangeBase<int>).range.allocator,0x10);
      pSVar5[1].next = (Type)CONCAT44(iVar4,uVar3);
      pSVar5->next = (pRange->super_RangeBase<int>).range.
                     super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
                     super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
      (pRange->super_RangeBase<int>).range.
      super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
      super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = pSVar5;
      pRVar1 = &(pRange->super_RangeBase<int>).range.
                super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      pWVar6 = this->pszCurrentArg;
      WVar2 = *pWVar6;
      if (WVar2 != L',') {
        if ((WVar2 == L'\0') || (WVar2 == L' ')) {
          return;
        }
LAB_00351486:
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar8 = L"Unexpected character while parsing Range";
LAB_003514aa:
        *puVar7 = pcVar8;
        __cxa_throw(puVar7,&Exception::typeinfo,0);
      }
    }
    this->pszCurrentArg = pWVar6 + 1;
  } while( true );
}

Assistant:

void
CmdLineArgsParser::ParseNumberRange(Js::NumberRange *pRange)
{
    int start = ParseInteger();
    int end;

    switch (CurChar())
    {
    case '-':
        NextChar();
        end = ParseInteger();

        if (start > end)
        {
            throw Exception(_u("Range start must be less than range end"));
        }

        pRange->Add(start, end);
        switch (CurChar())
        {
        case ',':
            NextChar();
            ParseNumberRange(pRange);
            break;

        case ' ':
        case 0:
            break;

        default:
            throw Exception(_u("Unexpected character while parsing Range"));
        }
        break;

    case ',':
        pRange->Add(start);
        NextChar();
        ParseNumberRange(pRange);
        break;

    case ' ':
    case 0:
        pRange->Add(start);
        break;

    default:
        throw Exception(_u("Unexpected character while parsing Range"));
    }

}